

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_scan.hpp
# Opt level: O1

void __thiscall
duckdb::AlpScanState<double>::LoadVector<false>(AlpScanState<double> *this,double *value_buffer)

{
  byte bVar1;
  ushort uVar2;
  unsigned_long uVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  ulong count;
  
  (this->vector_state).index = 0;
  pdVar4 = this->metadata_ptr;
  this->metadata_ptr = pdVar4 + -4;
  count = this->count - this->total_value_count;
  if (0x3ff < count) {
    count = 0x400;
  }
  pdVar4 = this->segment_data + (ulong)*(uint *)(pdVar4 + -4) + 0xd;
  (this->vector_state).v_exponent = pdVar4[-0xd];
  (this->vector_state).v_factor = pdVar4[-0xc];
  (this->vector_state).exceptions_count = *(uint16_t *)(pdVar4 + -0xb);
  (this->vector_state).frame_of_reference = *(uint64_t *)(pdVar4 + -9);
  bVar1 = pdVar4[-1];
  (this->vector_state).bit_width = bVar1;
  if ((ulong)bVar1 != 0) {
    uVar5 = count;
    if ((count & 0x1f) != 0) {
      uVar3 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
      uVar5 = (count - uVar3) + 0x20;
    }
    uVar5 = uVar5 * bVar1 >> 3;
    switchD_012dd528::default((this->vector_state).for_encoded,pdVar4,uVar5);
    pdVar4 = pdVar4 + uVar5;
  }
  uVar2 = (this->vector_state).exceptions_count;
  if (uVar2 != 0) {
    switchD_012dd528::default((this->vector_state).exceptions,pdVar4,(ulong)uVar2 << 3);
    uVar2 = (this->vector_state).exceptions_count;
    switchD_012dd528::default
              ((this->vector_state).exceptions_positions,pdVar4 + (ulong)uVar2 * 8,
               (ulong)((uint)uVar2 * 2));
  }
  *value_buffer = 0.0;
  alp::AlpDecompression<double>::Decompress
            ((this->vector_state).for_encoded,value_buffer,count,(this->vector_state).v_factor,
             (this->vector_state).v_exponent,(this->vector_state).exceptions_count,
             (this->vector_state).exceptions,(this->vector_state).exceptions_positions,
             (this->vector_state).frame_of_reference,(this->vector_state).bit_width);
  return;
}

Assistant:

void LoadVector(T *value_buffer) {
		vector_state.Reset();

		// Load the offset (metadata) indicating where the vector data starts
		metadata_ptr -= AlpConstants::METADATA_POINTER_SIZE;
		auto data_byte_offset = Load<uint32_t>(metadata_ptr);
		D_ASSERT(data_byte_offset < segment.GetBlockManager().GetBlockSize());

		idx_t vector_size = MinValue((idx_t)AlpConstants::ALP_VECTOR_SIZE, (count - total_value_count));

		data_ptr_t vector_ptr = segment_data + data_byte_offset;

		// Load the vector data
		vector_state.v_exponent = Load<uint8_t>(vector_ptr);
		vector_ptr += AlpConstants::EXPONENT_SIZE;

		vector_state.v_factor = Load<uint8_t>(vector_ptr);
		vector_ptr += AlpConstants::FACTOR_SIZE;

		vector_state.exceptions_count = Load<uint16_t>(vector_ptr);
		vector_ptr += AlpConstants::EXCEPTIONS_COUNT_SIZE;

		vector_state.frame_of_reference = Load<uint64_t>(vector_ptr);
		vector_ptr += AlpConstants::FOR_SIZE;

		vector_state.bit_width = Load<uint8_t>(vector_ptr);
		vector_ptr += AlpConstants::BIT_WIDTH_SIZE;

		D_ASSERT(vector_state.exceptions_count <= vector_size);
		D_ASSERT(vector_state.v_exponent <= AlpTypedConstants<T>::MAX_EXPONENT);
		D_ASSERT(vector_state.v_factor <= vector_state.v_exponent);
		D_ASSERT(vector_state.bit_width <= sizeof(uint64_t) * 8);

		if (vector_state.bit_width > 0) {
			auto bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.bit_width);
			memcpy(vector_state.for_encoded, (void *)vector_ptr, bp_size);
			vector_ptr += bp_size;
		}

		if (vector_state.exceptions_count > 0) {
			memcpy(vector_state.exceptions, (void *)vector_ptr, sizeof(EXACT_TYPE) * vector_state.exceptions_count);
			vector_ptr += sizeof(EXACT_TYPE) * vector_state.exceptions_count;
			memcpy(vector_state.exceptions_positions, (void *)vector_ptr,
			       AlpConstants::EXCEPTION_POSITION_SIZE * vector_state.exceptions_count);
		}

		// Decode all the vector values to the specified 'value_buffer'
		vector_state.template LoadValues<SKIP>(value_buffer, vector_size);
	}